

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangePerformanceCase::callDraw(StateChangePerformanceCase *this,Functions *gl)

{
  DrawType DVar1;
  int iVar2;
  glDrawElementsFunc p_Var3;
  reference pvVar4;
  Functions *gl_local;
  StateChangePerformanceCase *this_local;
  
  DVar1 = this->m_drawType;
  if (DVar1 == DRAWTYPE_NOT_INDEXED) {
    (*gl->drawArrays)(4,0,this->m_triangleCount * 3);
  }
  else if (DVar1 == DRAWTYPE_INDEXED_USER_PTR) {
    p_Var3 = gl->drawElements;
    iVar2 = this->m_triangleCount;
    pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->m_indices,0);
    (*p_Var3)(4,iVar2 * 3,0x1403,pvVar4);
  }
  else if (DVar1 == DRAWTYPE_INDEXED_BUFFER) {
    (*gl->drawElements)(4,this->m_triangleCount * 3,0x1403,(void *)0x0);
  }
  return;
}

Assistant:

void StateChangePerformanceCase::callDraw (const glw::Functions& gl)
{
	switch (m_drawType)
	{
		case DRAWTYPE_NOT_INDEXED:		gl.drawArrays(GL_TRIANGLES, 0, m_triangleCount * 3);									break;
		case DRAWTYPE_INDEXED_USER_PTR:	gl.drawElements(GL_TRIANGLES, m_triangleCount * 3, GL_UNSIGNED_SHORT, &m_indices[0]);	break;
		case DRAWTYPE_INDEXED_BUFFER:	gl.drawElements(GL_TRIANGLES, m_triangleCount * 3, GL_UNSIGNED_SHORT, NULL);			break;
		default:
			DE_ASSERT(false);
	}
}